

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_response.hpp
# Opt level: O0

void __thiscall
cinatra::coro_http_response::build_resp_str(coro_http_response *this,string *resp_str)

{
  bool bVar1;
  size_type __len;
  bool *pbVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  coro_http_response *in_RDI;
  string_view sVar3;
  to_chars_result tVar4;
  bool keepalive;
  char *ptr;
  size_t content_size;
  bool has_host;
  bool has_len;
  int in_stack_ffffffffffffff4c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  coro_http_response *in_stack_ffffffffffffff70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *resp_headers;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  char *local_50;
  errc local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  undefined1 in_stack_ffffffffffffffc8 [16];
  undefined6 in_stack_ffffffffffffffd8;
  byte bVar5;
  byte bVar6;
  coro_http_response *this_00;
  
  resp_headers = in_RSI;
  sVar3 = to_http_status_string(in_RDI->status_);
  this_00 = (coro_http_response *)sVar3._M_len;
  std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff70,
             (basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff68);
  bVar6 = 0;
  bVar5 = 0;
  check_header<std::vector<cinatra::resp_header,std::allocator<cinatra::resp_header>>>
            (in_RDI,(vector<cinatra::resp_header,_std::allocator<cinatra::resp_header>_> *)
                    resp_headers,(bool *)in_stack_ffffffffffffff70,(bool *)in_stack_ffffffffffffff68
            );
  bVar1 = std::span<cinatra::http_header,_18446744073709551615UL>::empty
                    ((span<cinatra::http_header,_18446744073709551615UL> *)0x277c29);
  if (!bVar1) {
    check_header<std::span<cinatra::http_header,18446744073709551615ul>>
              (this_00,(span<cinatra::http_header,_18446744073709551615UL> *)
                       CONCAT17(bVar6,CONCAT16(bVar5,in_stack_ffffffffffffffd8)),
               in_stack_ffffffffffffffc8._8_8_,in_stack_ffffffffffffffc8._0_8_);
  }
  if ((bVar5 & 1) == 0) {
    std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff70,
               (basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff68);
  }
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x277c7a);
  if (((bVar1) && ((in_RDI->has_set_content_ & 1U) == 0)) && (in_RDI->fmt_type_ != chunked)) {
    in_stack_ffffffffffffff70 = (coro_http_response *)&in_RDI->content_;
    default_status_content((status_type)((ulong)in_stack_ffffffffffffff60 >> 0x20));
    std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff70,
               (basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff68);
  }
  if (in_RDI->fmt_type_ == chunked) {
    std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff70,
               (basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff68);
  }
  else {
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x277d05
                      );
    if ((bVar1) &&
       (bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&in_RDI->content_view_)
       , bVar1)) {
      if (((bVar6 & 1) == 0) &&
         (bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x277e2b), bVar1)) {
        std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffff70,
                   (basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff68);
      }
    }
    else {
      bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x277d32);
      if (bVar1) {
        in_stack_ffffffffffffff68 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::basic_string_view<char,_std::char_traits<char>_>::size(&in_RDI->content_view_);
      }
      else {
        in_stack_ffffffffffffff68 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                       (&in_RDI->content_);
      }
      local_40 = in_stack_ffffffffffffff68;
      tVar4 = std::to_chars((char *)in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58,
                            (unsigned_long)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
      local_50 = tVar4.ptr;
      local_48 = tVar4.ec;
      std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff70,
                 (basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff68);
      in_stack_ffffffffffffff58 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI->buf_;
      in_stack_ffffffffffffff60 = in_RSI;
      __len = std::distance<char*>((char *)in_RSI,(char *)in_stack_ffffffffffffff58);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_60,(char *)in_stack_ffffffffffffff58,__len);
      std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff70,
                 (basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff68);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    }
  }
  if ((in_RDI->need_date_ & 1U) != 0) {
    std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff70,
               (basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff68);
    get_gmt_time_str();
    std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff70,
               (basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff68);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    in_stack_ffffffffffffff50 = in_RSI;
  }
  bVar1 = std::optional<bool>::has_value((optional<bool> *)0x277eb8);
  if (bVar1) {
    pbVar2 = std::optional<bool>::value((optional<bool> *)in_stack_ffffffffffffff50);
    if ((*pbVar2 & 1U) == 0) {
      std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff70,
                 (basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff68);
    }
    else {
      std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff70,
                 (basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff68);
    }
  }
  append_header_str<std::__cxx11::string,std::vector<cinatra::resp_header,std::allocator<cinatra::resp_header>>>
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
             (vector<cinatra::resp_header,_std::allocator<cinatra::resp_header>_> *)
             in_stack_ffffffffffffff60);
  bVar1 = std::span<cinatra::http_header,_18446744073709551615UL>::empty
                    ((span<cinatra::http_header,_18446744073709551615UL> *)0x277f2c);
  if (!bVar1) {
    append_header_str<std::__cxx11::string,std::span<cinatra::http_header,18446744073709551615ul>>
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
               (span<cinatra::http_header,_18446744073709551615UL> *)in_stack_ffffffffffffff60);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&in_RDI->content_view_);
  if (bVar1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  }
  else {
    std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff70,
               (basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff68);
  }
  return;
}

Assistant:

void build_resp_str(std::string &resp_str) {
    resp_str.append(to_http_status_string(status_));
    bool has_len = false;
    bool has_host = false;
    check_header(resp_headers_, has_len, has_host);
    if (!resp_header_span_.empty()) {
      check_header(resp_header_span_, has_len, has_host);
    }

    if (!has_host) {
      resp_str.append(CINATRA_HOST_SV);
    }

    if (content_.empty() && !has_set_content_ &&
        fmt_type_ != format_type::chunked) {
      content_.append(default_status_content(status_));
    }

    if (fmt_type_ == format_type::chunked) {
      resp_str.append(TRANSFER_ENCODING_SV);
    }
    else {
      if (!content_.empty() || !content_view_.empty()) {
        size_t content_size =
            content_.empty() ? content_view_.size() : content_.size();
        auto [ptr, ec] = std::to_chars(buf_, buf_ + 32, content_size);
        resp_str.append(CONTENT_LENGTH_SV);
        resp_str.append(std::string_view(buf_, std::distance(buf_, ptr)));
        resp_str.append(CRCF);
      }
      else {
        if (!has_len && boundary_.empty())
          resp_str.append(ZERO_LENGTH_SV);
      }
    }

    if (need_date_) {
      resp_str.append(DATE_SV);
      resp_str.append(get_gmt_time_str());
      resp_str.append(CRCF);
    }

    if (keepalive_.has_value()) {
      bool keepalive = keepalive_.value();
      keepalive ? resp_str.append(CONN_KEEP_SV)
                : resp_str.append(CONN_CLOSE_SV);
    }

    append_header_str(resp_str, resp_headers_);

    if (!resp_header_span_.empty()) {
      append_header_str(resp_str, resp_header_span_);
    }

    resp_str.append(CRCF);
    if (content_view_.empty()) {
      resp_str.append(content_);
    }
    else {
      resp_str.append(content_view_);
    }
  }